

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_clean_internal(void **p,int x)

{
  void **q;
  int i;
  int x_local;
  void **p_local;
  
  if (x < 2) {
    for (q._0_4_ = 0; (int)q < 0x400; q._0_4_ = (int)q + 1) {
      if (p[(int)q] != (gpointer)0x0) {
        g_free(p[(int)q]);
      }
    }
    g_free(p);
  }
  else {
    for (q._0_4_ = 0; (int)q < 0x400; q._0_4_ = (int)q + 1) {
      if ((void **)p[(int)q] != (void **)0x0) {
        tb_clean_internal((void **)p[(int)q],x + -1);
      }
    }
    g_free(p);
  }
  return;
}

Assistant:

static void tb_clean_internal(void **p, int x)
{
    int i;
    void **q;

    if (x <= 1) {
        for (i = 0; i < V_L2_SIZE; i++) {
            q = p[i];
            if (q) {
                g_free(q);
            }
        }
        g_free(p);
    } else {
        for (i = 0; i < V_L2_SIZE; i++) {
            q = p[i];
            if (q) {
                tb_clean_internal(q, x - 1);
            }
        }
        g_free(p);
    }
}